

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

string * __thiscall
cfd::core::ScriptOperator::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptOperator *this)

{
  ScriptType SVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  
  sVar3 = (this->text_data_)._M_string_length;
  if (sVar3 == 0) {
    if (g_operator_map._16_8_ == 0 || g_operator_map._40_8_ == 0) {
LAB_00400f2d:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"UNKNOWN","");
      return __return_storage_ptr__;
    }
    do {
      SVar1 = this->data_type_;
      lVar4 = 0x6b9198;
      lVar5 = g_operator_map._16_8_;
      do {
        if ((int)SVar1 <= *(int *)(lVar5 + 0x20)) {
          lVar4 = lVar5;
        }
        lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < (int)SVar1) * 8);
      } while (lVar5 != 0);
      if ((lVar4 == 0x6b9198) || ((int)SVar1 < *(int *)(lVar4 + 0x20))) goto LAB_00400f2d;
      sVar3 = *(size_type *)(lVar4 + 0x40);
      this = (ScriptOperator *)(lVar4 + 0x28);
    } while (sVar3 == 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->text_data_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToString() const {
  if (text_data_.empty()) {
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite =
          g_operator_map.find(data_type_);
      if (ite != g_operator_map.end()) {
        return ite->second.ToString();
      }
    }
    return "UNKNOWN";
  }
  return text_data_;
}